

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O0

void __thiscall ncnn::Convolution_x86_avx::Convolution_x86_avx(Convolution_x86_avx *this)

{
  undefined8 *in_RDI;
  Convolution *in_stack_ffffffffffffff20;
  
  Convolution::Convolution(in_stack_ffffffffffffff20);
  *in_RDI = &PTR__Convolution_x86_avx_020274e8;
  in_RDI[0x5b] = 0;
  in_RDI[0x5c] = 0;
  in_RDI[0x5d] = 0;
  *(undefined4 *)(in_RDI + 0x5e) = 0;
  in_RDI[0x5f] = 0;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)((long)in_RDI + 0x304) = 0;
  *(undefined4 *)(in_RDI + 0x61) = 0;
  *(undefined4 *)((long)in_RDI + 0x30c) = 0;
  *(undefined4 *)(in_RDI + 0x62) = 0;
  in_RDI[99] = 0;
  in_RDI[100] = 0;
  in_RDI[0x65] = 0;
  in_RDI[0x66] = 0;
  *(undefined4 *)(in_RDI + 0x67) = 0;
  in_RDI[0x68] = 0;
  *(undefined4 *)(in_RDI + 0x69) = 0;
  *(undefined4 *)((long)in_RDI + 0x34c) = 0;
  *(undefined4 *)(in_RDI + 0x6a) = 0;
  *(undefined4 *)((long)in_RDI + 0x354) = 0;
  *(undefined4 *)(in_RDI + 0x6b) = 0;
  in_RDI[0x6c] = 0;
  in_RDI[0x6d] = 0;
  in_RDI[0x6e] = 0;
  in_RDI[0x6f] = 0;
  *(undefined4 *)(in_RDI + 0x70) = 0;
  in_RDI[0x71] = 0;
  *(undefined4 *)(in_RDI + 0x72) = 0;
  *(undefined4 *)((long)in_RDI + 0x394) = 0;
  *(undefined4 *)(in_RDI + 0x73) = 0;
  *(undefined4 *)((long)in_RDI + 0x39c) = 0;
  *(undefined4 *)(in_RDI + 0x74) = 0;
  in_RDI[0x75] = 0;
  in_RDI[0x76] = 0;
  in_RDI[0x77] = 0;
  in_RDI[0x78] = 0;
  *(undefined4 *)(in_RDI + 0x79) = 0;
  in_RDI[0x7a] = 0;
  *(undefined4 *)(in_RDI + 0x7b) = 0;
  *(undefined4 *)((long)in_RDI + 0x3dc) = 0;
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  *(undefined4 *)((long)in_RDI + 0x3e4) = 0;
  *(undefined4 *)(in_RDI + 0x7d) = 0;
  in_RDI[0x7e] = 0;
  in_RDI[0x7f] = 0;
  in_RDI[0x80] = 0;
  in_RDI[0x81] = 0;
  *(undefined4 *)(in_RDI + 0x82) = 0;
  in_RDI[0x83] = 0;
  *(undefined4 *)(in_RDI + 0x84) = 0;
  *(undefined4 *)((long)in_RDI + 0x424) = 0;
  *(undefined4 *)(in_RDI + 0x85) = 0;
  *(undefined4 *)((long)in_RDI + 0x42c) = 0;
  *(undefined4 *)(in_RDI + 0x86) = 0;
  in_RDI[0x87] = 0;
  in_RDI[0x89] = 0;
  in_RDI[0x8a] = 0;
  in_RDI[0x8b] = 0;
  *(undefined4 *)(in_RDI + 0x8c) = 0;
  in_RDI[0x8d] = 0;
  *(undefined4 *)(in_RDI + 0x8e) = 0;
  *(undefined4 *)((long)in_RDI + 0x474) = 0;
  *(undefined4 *)(in_RDI + 0x8f) = 0;
  *(undefined4 *)((long)in_RDI + 0x47c) = 0;
  *(undefined4 *)(in_RDI + 0x90) = 0;
  in_RDI[0x91] = 0;
  *(undefined1 *)((long)in_RDI + 0xb) = 1;
  in_RDI[0x59] = 0;
  *(undefined4 *)(in_RDI + 0x5a) = 0;
  in_RDI[0x88] = 0;
  return;
}

Assistant:

Convolution_x86_avx::Convolution_x86_avx()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    activation = 0;
    nT = 0;
    convolution_dilation1 = 0;
}